

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

bool IsLiveAt(VmInstruction *inst,VmInstruction *point)

{
  uint uVar1;
  VmBlock *pVVar2;
  long lVar3;
  bool bVar4;
  
  pVVar2 = point->parent;
  if (pVVar2 == inst->parent) {
    bVar4 = IsAfter(inst,point);
    if (!bVar4) {
      uVar1 = (pVVar2->liveOut).count;
      if (uVar1 != 0) {
        lVar3 = 0;
        do {
          if ((pVVar2->liveOut).data[lVar3] == inst) {
            return true;
          }
          lVar3 = lVar3 + 1;
        } while (uVar1 != (uint)lVar3);
      }
      for (; bVar4 = point == (VmInstruction *)0x0, !bVar4; point = point->nextSibling) {
        uVar1 = (point->arguments).count;
        if (uVar1 != 0) {
          lVar3 = 0;
          do {
            if ((VmInstruction *)(point->arguments).data[lVar3] == inst) goto LAB_001a9dc7;
            lVar3 = lVar3 + 1;
          } while (uVar1 != (uint)lVar3);
        }
      }
    }
  }
  else {
    uVar1 = (pVVar2->liveIn).count;
    if (uVar1 != 0) {
      lVar3 = 0;
      do {
        if ((pVVar2->liveIn).data[lVar3] == inst) {
          uVar1 = (pVVar2->liveOut).count;
          if (uVar1 != 0) {
            lVar3 = 0;
            do {
              if ((pVVar2->liveOut).data[lVar3] == inst) {
                return true;
              }
              lVar3 = lVar3 + 1;
            } while (uVar1 != (uint)lVar3);
          }
          do {
            bVar4 = point == (VmInstruction *)0x0;
            if (bVar4) {
              return false;
            }
            uVar1 = (point->arguments).count;
            if (uVar1 != 0) {
              lVar3 = 0;
              do {
                if ((VmInstruction *)(point->arguments).data[lVar3] == inst) {
LAB_001a9dc7:
                  if (bVar4) {
                    return false;
                  }
                  return true;
                }
                lVar3 = lVar3 + 1;
              } while (uVar1 != (uint)lVar3);
            }
            point = point->nextSibling;
          } while( true );
        }
        lVar3 = lVar3 + 1;
      } while (uVar1 != (uint)lVar3);
    }
  }
  return false;
}

Assistant:

bool IsLiveAt(VmInstruction *inst, VmInstruction *point)
{
	VmBlock *definitionBlock = inst->parent;

	VmBlock *pointBlock = point->parent;

	// If both instructions are in the same block
	if(pointBlock == definitionBlock)
	{
		// If definition is after the point, then it's not live yet
		if(IsAfter(inst, point))
			return false;

		// If definition is before the point, we must find out if it's live yet

		// If it's live-out, then it's live at point
		for(unsigned i = 0; i < pointBlock->liveOut.size(); i++)
		{
			if(pointBlock->liveOut[i] == inst)
				return true;
		}

		// Check if it's used at point or after it
		VmInstruction *curr = point;

		while(curr)
		{
			for(unsigned i = 0; i < curr->arguments.size(); i++)
			{
				if(curr->arguments[i] == inst)
					return true;
			}

			curr = curr->nextSibling;
		}
	}
	else
	{
		// If instruction is not live-in at point block then it's not live
		bool liveIn = false;

		for(unsigned i = 0; i < pointBlock->liveIn.size(); i++)
		{
			if(pointBlock->liveIn[i] == inst)
			{
				liveIn = true;
				break;
			}
		}

		if(liveIn)
		{
			// If it's live-out, then it's live at point
			for(unsigned i = 0; i < pointBlock->liveOut.size(); i++)
			{
				if(pointBlock->liveOut[i] == inst)
					return true;
			}

			// Check if it's used at point or after it
			VmInstruction *curr = point;

			while(curr)
			{
				for(unsigned i = 0; i < curr->arguments.size(); i++)
				{
					if(curr->arguments[i] == inst)
						return true;
				}

				curr = curr->nextSibling;
			}
		}
	}

	return false;
}